

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::AS02_MCAConfigParser::AS02_MCAConfigParser(AS02_MCAConfigParser *this,Dictionary *d)

{
  byte_t *pbVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>,_bool>
  pVar2;
  UL local_1558;
  allocator<char> local_1531;
  string local_1530;
  label_traits local_1510;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_14c8;
  uint local_145c;
  undefined8 uStack_1458;
  int i;
  byte_t ul_buf [16];
  char symbol_buf [64];
  char name_buf [64];
  UL local_13b0;
  allocator<char> local_1389;
  string local_1388;
  label_traits local_1368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1320;
  _Base_ptr local_12b8;
  undefined1 local_12b0;
  UL local_12a8;
  allocator<char> local_1281;
  string local_1280;
  label_traits local_1260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1218;
  _Base_ptr local_11b0;
  undefined1 local_11a8;
  UL local_11a0;
  allocator<char> local_1179;
  string local_1178;
  label_traits local_1158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1110;
  _Base_ptr local_10a8;
  undefined1 local_10a0;
  UL local_1098;
  allocator<char> local_1071;
  string local_1070;
  label_traits local_1050;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_1008;
  _Base_ptr local_fa0;
  undefined1 local_f98;
  UL local_f90;
  allocator<char> local_f69;
  string local_f68;
  label_traits local_f48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_f00;
  _Base_ptr local_e98;
  undefined1 local_e90;
  UL local_e88;
  allocator<char> local_e61;
  string local_e60;
  label_traits local_e40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_df8;
  _Base_ptr local_d90;
  undefined1 local_d88;
  UL local_d80;
  allocator<char> local_d59;
  string local_d58;
  label_traits local_d38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_cf0;
  _Base_ptr local_c88;
  undefined1 local_c80;
  UL local_c78;
  allocator<char> local_c51;
  string local_c50;
  label_traits local_c30;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_be8;
  _Base_ptr local_b80;
  undefined1 local_b78;
  UL local_b70;
  allocator<char> local_b49;
  string local_b48;
  label_traits local_b28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_ae0;
  _Base_ptr local_a78;
  undefined1 local_a70;
  UL local_a68;
  allocator<char> local_a41;
  string local_a40;
  label_traits local_a20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_9d8;
  _Base_ptr local_970;
  undefined1 local_968;
  UL local_960;
  allocator<char> local_939;
  string local_938;
  label_traits local_918;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_8d0;
  _Base_ptr local_868;
  undefined1 local_860;
  UL local_858;
  allocator<char> local_831;
  string local_830;
  label_traits local_810;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_7c8;
  _Base_ptr local_760;
  undefined1 local_758;
  UL local_750;
  allocator<char> local_729;
  string local_728;
  label_traits local_708;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_6c0;
  _Base_ptr local_658;
  undefined1 local_650;
  UL local_648;
  allocator<char> local_621;
  string local_620;
  label_traits local_600;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_5b8;
  _Base_ptr local_550;
  undefined1 local_548;
  UL local_540;
  allocator<char> local_519;
  string local_518;
  label_traits local_4f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_4b0;
  _Base_ptr local_448;
  undefined1 local_440;
  UL local_438;
  allocator<char> local_411;
  string local_410;
  label_traits local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_3a8;
  _Base_ptr local_340;
  undefined1 local_338;
  UL local_330;
  allocator<char> local_309;
  string local_308;
  label_traits local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_2a0;
  _Base_ptr local_238;
  undefined1 local_230;
  UL local_228;
  allocator<char> local_201;
  string local_200;
  label_traits local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_198;
  _Base_ptr local_130;
  undefined1 local_128;
  UL local_120;
  allocator<char> local_e9;
  string local_e8;
  label_traits local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  local_80;
  Dictionary *local_18;
  Dictionary *d_local;
  AS02_MCAConfigParser *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  ASDCP_MCAConfigParser::ASDCP_MCAConfigParser(&this->super_ASDCP_MCAConfigParser,d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"Mono One",&local_e9);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_M1);
  UL::UL(&local_120,pbVar1);
  label_traits::label_traits(&local_c8,&local_e8,true,&local_120);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_80,(char (*) [3])0x2d071a,&local_c8);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_80);
  local_130 = (_Base_ptr)pVar2.first._M_node;
  local_128 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_80);
  label_traits::~label_traits(&local_c8);
  UL::~UL(&local_120);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"Mono Two",&local_201);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_M2);
  UL::UL(&local_228,pbVar1);
  label_traits::label_traits(&local_1e0,&local_200,true,&local_228);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_198,(char (*) [3])0x2d072d,&local_1e0);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_198);
  local_238 = (_Base_ptr)pVar2.first._M_node;
  local_230 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_198);
  label_traits::~label_traits(&local_1e0);
  UL::~UL(&local_228);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Left Total",&local_309);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Lt);
  UL::UL(&local_330,pbVar1);
  label_traits::label_traits(&local_2e8,&local_308,true,&local_330);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_2a0,(char (*) [3])0x2d0740,&local_2e8);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_2a0);
  local_340 = (_Base_ptr)pVar2.first._M_node;
  local_338 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_2a0);
  label_traits::~label_traits(&local_2e8);
  UL::~UL(&local_330);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"Right Total",&local_411);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Rt);
  UL::UL(&local_438,pbVar1);
  label_traits::label_traits(&local_3f0,&local_410,true,&local_438);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_3a8,(char (*) [3])0x2d4820,&local_3f0);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_3a8);
  local_448 = (_Base_ptr)pVar2.first._M_node;
  local_440 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_3a8);
  label_traits::~label_traits(&local_3f0);
  UL::~UL(&local_438);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"Left Surround Total",&local_519);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Lst);
  UL::UL(&local_540,pbVar1);
  label_traits::label_traits(&local_4f8,&local_518,true,&local_540);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_4b0,(char (*) [4])0x2d0766,&local_4f8);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_4b0);
  local_550 = (_Base_ptr)pVar2.first._M_node;
  local_548 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_4b0);
  label_traits::~label_traits(&local_4f8);
  UL::~UL(&local_540);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator(&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"Right Surround Total",&local_621);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_Rst);
  UL::UL(&local_648,pbVar1);
  label_traits::label_traits(&local_600,&local_620,true,&local_648);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_5b8,(char (*) [4])0x2d077a,&local_600);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_5b8);
  local_658 = (_Base_ptr)pVar2.first._M_node;
  local_650 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_5b8);
  label_traits::~label_traits(&local_600);
  UL::~UL(&local_648);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"Surround",&local_729);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioChannel_S);
  UL::UL(&local_750,pbVar1);
  label_traits::label_traits(&local_708,&local_728,true,&local_750);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[2],_ASDCP::MXF::label_traits,_true>
            (&local_6c0,(char (*) [2])0x2d481b,&local_708);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_6c0);
  local_760 = (_Base_ptr)pVar2.first._M_node;
  local_758 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_6c0);
  label_traits::~label_traits(&local_708);
  UL::~UL(&local_750);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,"Standard Stereo",&local_831);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_ST);
  UL::UL(&local_858,pbVar1);
  label_traits::label_traits(&local_810,&local_830,true,&local_858);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_7c8,(char (*) [3])0x2dab63,&local_810);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_7c8);
  local_868 = (_Base_ptr)pVar2.first._M_node;
  local_860 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_7c8);
  label_traits::~label_traits(&local_810);
  UL::~UL(&local_858);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"Dual Mono",&local_939);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_DM);
  UL::UL(&local_960,pbVar1);
  label_traits::label_traits(&local_918,&local_938,true,&local_960);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_8d0,(char (*) [3])0x2d2349,&local_918);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_8d0);
  local_970 = (_Base_ptr)pVar2.first._M_node;
  local_968 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_8d0);
  label_traits::~label_traits(&local_918);
  UL::~UL(&local_960);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a40,"Discrete Numbered Sources",&local_a41);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_DNS);
  UL::UL(&local_a68,pbVar1);
  label_traits::label_traits(&local_a20,&local_a40,true,&local_a68);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[4],_ASDCP::MXF::label_traits,_true>
            (&local_9d8,(char (*) [4])0x2d07e8,&local_a20);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_9d8);
  local_a78 = (_Base_ptr)pVar2.first._M_node;
  local_a70 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_9d8);
  label_traits::~label_traits(&local_a20);
  UL::~UL(&local_a68);
  std::__cxx11::string::~string((string *)&local_a40);
  std::allocator<char>::~allocator(&local_a41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b48,"3.0",&local_b49);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_30);
  UL::UL(&local_b70,pbVar1);
  label_traits::label_traits(&local_b28,&local_b48,true,&local_b70);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_ae0,(char (*) [3])0x2d07ff,&local_b28);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_ae0);
  local_b80 = (_Base_ptr)pVar2.first._M_node;
  local_b78 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_ae0);
  label_traits::~label_traits(&local_b28);
  UL::~UL(&local_b70);
  std::__cxx11::string::~string((string *)&local_b48);
  std::allocator<char>::~allocator(&local_b49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c50,"4.0",&local_c51);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_40);
  UL::UL(&local_c78,pbVar1);
  label_traits::label_traits(&local_c30,&local_c50,true,&local_c78);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_be8,(char (*) [3])0x2d0815,&local_c30);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_be8);
  local_c88 = (_Base_ptr)pVar2.first._M_node;
  local_c80 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_be8);
  label_traits::~label_traits(&local_c30);
  UL::~UL(&local_c78);
  std::__cxx11::string::~string((string *)&local_c50);
  std::allocator<char>::~allocator(&local_c51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d58,"5.0",&local_d59);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_50);
  UL::UL(&local_d80,pbVar1);
  label_traits::label_traits(&local_d38,&local_d58,true,&local_d80);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_cf0,(char (*) [3])0x2d082b,&local_d38);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_cf0);
  local_d90 = (_Base_ptr)pVar2.first._M_node;
  local_d88 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_cf0);
  label_traits::~label_traits(&local_d38);
  UL::~UL(&local_d80);
  std::__cxx11::string::~string((string *)&local_d58);
  std::allocator<char>::~allocator(&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e60,"6.0",&local_e61);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_60);
  UL::UL(&local_e88,pbVar1);
  label_traits::label_traits(&local_e40,&local_e60,true,&local_e88);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_df8,(char (*) [3])0x2d0841,&local_e40);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_df8);
  local_e98 = (_Base_ptr)pVar2.first._M_node;
  local_e90 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_df8);
  label_traits::~label_traits(&local_e40);
  UL::~UL(&local_e88);
  std::__cxx11::string::~string((string *)&local_e60);
  std::allocator<char>::~allocator(&local_e61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f68,"7.0DS",&local_f69);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_70);
  UL::UL(&local_f90,pbVar1);
  label_traits::label_traits(&local_f48,&local_f68,true,&local_f90);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_f00,(char (*) [3])0x2d2898,&local_f48);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_f00);
  local_fa0 = (_Base_ptr)pVar2.first._M_node;
  local_f98 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_f00);
  label_traits::~label_traits(&local_f48);
  UL::~UL(&local_f90);
  std::__cxx11::string::~string((string *)&local_f68);
  std::allocator<char>::~allocator(&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1070,"Lt-Rt",&local_1071);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_LtRt);
  UL::UL(&local_1098,pbVar1);
  label_traits::label_traits(&local_1050,&local_1070,true,&local_1098);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_1008,(char (*) [5])0x2d086d,&local_1050);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_1008);
  local_10a8 = (_Base_ptr)pVar2.first._M_node;
  local_10a0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1008);
  label_traits::~label_traits(&local_1050);
  UL::~UL(&local_1098);
  std::__cxx11::string::~string((string *)&local_1070);
  std::allocator<char>::~allocator(&local_1071);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1178,"5.1EX",&local_1179);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_51EX);
  UL::UL(&local_11a0,pbVar1);
  label_traits::label_traits(&local_1158,&local_1178,true,&local_11a0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[5],_ASDCP::MXF::label_traits,_true>
            (&local_1110,(char (*) [5])0x2d0885,&local_1158);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_1110);
  local_11b0 = (_Base_ptr)pVar2.first._M_node;
  local_11a8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1110);
  label_traits::~label_traits(&local_1158);
  UL::~UL(&local_11a0);
  std::__cxx11::string::~string((string *)&local_1178);
  std::allocator<char>::~allocator(&local_1179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1280,"Hearing Accessibility",&local_1281);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_HI);
  UL::UL(&local_12a8,pbVar1);
  label_traits::label_traits(&local_1260,&local_1280,true,&local_12a8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_1218,(char (*) [3])"HA",&local_1260);
  pVar2 = std::
          map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
          ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_1218);
  local_12b8 = (_Base_ptr)pVar2.first._M_node;
  local_12b0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1218);
  label_traits::~label_traits(&local_1260);
  UL::~UL(&local_12a8);
  std::__cxx11::string::~string((string *)&local_1280);
  std::allocator<char>::~allocator(&local_1281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1388,"Visual Accessibility",&local_1389);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFAudioSoundfield_VIN);
  UL::UL(&local_13b0,pbVar1);
  label_traits::label_traits(&local_1368,&local_1388,true,&local_13b0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::pair<const_char_(&)[3],_ASDCP::MXF::label_traits,_true>
            (&local_1320,(char (*) [3])"VA",&local_1368);
  std::
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
  ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_1320);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
  ::~pair(&local_1320);
  label_traits::~label_traits(&local_1368);
  UL::~UL(&local_13b0);
  std::__cxx11::string::~string((string *)&local_1388);
  std::allocator<char>::~allocator(&local_1389);
  pbVar1 = Dictionary::ul((this->super_ASDCP_MCAConfigParser).m_Dict,MDD_IMFNumberedSourceChannel);
  uStack_1458 = *(undefined8 *)pbVar1;
  ul_buf[5] = (byte_t)((ulong)*(undefined8 *)(pbVar1 + 8) >> 0x28);
  for (local_145c = 1; (int)local_145c < 0x80; local_145c = local_145c + 1) {
    snprintf(symbol_buf + 0x38,0x40,"Numbered Source Channel %03d",(ulong)local_145c);
    snprintf((char *)(ul_buf + 8),0x40,"NSC%03d",(ulong)local_145c);
    ul_buf[5] = (byte_t)local_145c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1530,symbol_buf + 0x38,&local_1531);
    UL::UL(&local_1558,(byte_t *)&stack0xffffffffffffeba8);
    label_traits::label_traits(&local_1510,&local_1530,true,&local_1558);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
    ::pair<char_(&)[64],_ASDCP::MXF::label_traits,_true>
              (&local_14c8,(char (*) [64])(ul_buf + 8),&local_1510);
    std::
    map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits,_ASDCP::MXF::ci_comp,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>_>_>
    ::insert(&(this->super_ASDCP_MCAConfigParser).m_LabelMap,&local_14c8);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_ASDCP::MXF::label_traits>
    ::~pair(&local_14c8);
    label_traits::~label_traits(&local_1510);
    UL::~UL(&local_1558);
    std::__cxx11::string::~string((string *)&local_1530);
    std::allocator<char>::~allocator(&local_1531);
  }
  return;
}

Assistant:

ASDCP::MXF::AS02_MCAConfigParser::AS02_MCAConfigParser(const Dictionary* d) : ASDCP::MXF::ASDCP_MCAConfigParser(d)
{
  typedef mca_label_map_t::value_type pair;
  m_LabelMap.insert(pair("M1",    label_traits("Mono One",  true,  m_Dict->ul(MDD_IMFAudioChannel_M1))));
  m_LabelMap.insert(pair("M2",    label_traits("Mono Two",  true,  m_Dict->ul(MDD_IMFAudioChannel_M2))));
  m_LabelMap.insert(pair("Lt",    label_traits("Left Total",  true,  m_Dict->ul(MDD_IMFAudioChannel_Lt))));
  m_LabelMap.insert(pair("Rt",    label_traits("Right Total",  true,  m_Dict->ul(MDD_IMFAudioChannel_Rt))));
  m_LabelMap.insert(pair("Lst",   label_traits("Left Surround Total", true,  m_Dict->ul(MDD_IMFAudioChannel_Lst))));
  m_LabelMap.insert(pair("Rst",   label_traits("Right Surround Total", true,  m_Dict->ul(MDD_IMFAudioChannel_Rst))));
  m_LabelMap.insert(pair("S",     label_traits("Surround",   true,  m_Dict->ul(MDD_IMFAudioChannel_S))));
  m_LabelMap.insert(pair("ST",    label_traits("Standard Stereo",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_ST))));
  m_LabelMap.insert(pair("DM",    label_traits("Dual Mono",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_DM))));
  m_LabelMap.insert(pair("DNS",   label_traits("Discrete Numbered Sources", true,  m_Dict->ul(MDD_IMFAudioSoundfield_DNS))));
  m_LabelMap.insert(pair("30",    label_traits("3.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_30))));
  m_LabelMap.insert(pair("40",    label_traits("4.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_40))));
  m_LabelMap.insert(pair("50",    label_traits("5.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_50))));
  m_LabelMap.insert(pair("60",    label_traits("6.0",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_60))));
  m_LabelMap.insert(pair("70",    label_traits("7.0DS",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_70))));
  m_LabelMap.insert(pair("LtRt",  label_traits("Lt-Rt",true,  m_Dict->ul(MDD_IMFAudioSoundfield_LtRt))));
  m_LabelMap.insert(pair("51EX",  label_traits("5.1EX",true,  m_Dict->ul(MDD_IMFAudioSoundfield_51EX))));
  m_LabelMap.insert(pair("HA",    label_traits("Hearing Accessibility",  true,  m_Dict->ul(MDD_IMFAudioSoundfield_HI))));
  m_LabelMap.insert(pair("VA",   label_traits("Visual Accessibility", true,  m_Dict->ul(MDD_IMFAudioSoundfield_VIN))));

  // assemble the  set of Numbered Source Channel labels
  char name_buf[64], symbol_buf[64];
  byte_t ul_buf[16];
  memcpy(ul_buf, m_Dict->ul(MDD_IMFNumberedSourceChannel), 16);

  for ( int i = 1; i < 128; ++i )
    {
      snprintf(name_buf, 64, "Numbered Source Channel %03d", i);
      snprintf(symbol_buf, 64, "NSC%03d", i);
      ul_buf[13] = i;
      m_LabelMap.insert(pair(symbol_buf, label_traits(name_buf, true, UL(ul_buf))));
    }
}